

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.cpp
# Opt level: O0

char * __thiscall CUnpacker::GetString(CUnpacker *this,int SanitizeType)

{
  uint in_ESI;
  long in_RDI;
  char *pPtr;
  char *local_30;
  undefined4 in_stack_ffffffffffffffe8;
  char *local_8;
  
  if ((*(int *)(in_RDI + 0x18) == 0) && (*(ulong *)(in_RDI + 8) < *(ulong *)(in_RDI + 0x10))) {
    local_30 = *(char **)(in_RDI + 8);
    do {
      if (**(char **)(in_RDI + 8) == '\0') {
        *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
        if ((in_ESI & 1) == 0) {
          if ((in_ESI & 2) != 0) {
            str_sanitize_cc(local_30);
          }
        }
        else {
          str_sanitize(local_30);
        }
        if ((in_ESI & 4) != 0) {
          local_30 = str_utf8_skip_whitespaces((char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        }
        return local_30;
      }
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    } while (*(long *)(in_RDI + 8) != *(long *)(in_RDI + 0x10));
    *(undefined4 *)(in_RDI + 0x18) = 1;
  }
  local_8 = "";
  return local_8;
}

Assistant:

const char *CUnpacker::GetString(int SanitizeType)
{
	if(m_Error || m_pCurrent >= m_pEnd)
		return "";

	char *pPtr = (char *)m_pCurrent;
	while(*m_pCurrent) // skip the string
	{
		m_pCurrent++;
		if(m_pCurrent == m_pEnd)
		{
			m_Error = 1;;
			return "";
		}
	}
	m_pCurrent++;

	// sanitize all strings
	if(SanitizeType&SANITIZE)
		str_sanitize(pPtr);
	else if(SanitizeType&SANITIZE_CC)
		str_sanitize_cc(pPtr);
	return SanitizeType&SKIP_START_WHITESPACES ? str_utf8_skip_whitespaces(pPtr) : pPtr;
}